

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O2

int get_signed_attribute(PKCS7_SIGNER_INFO *si,int nid,int type,char **buffer)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ASN1_TYPE *a;
  void *__src;
  
  pcVar3 = OBJ_nid2sn(nid);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x2d4,"finding attribute %s",pcVar3);
  a = PKCS7_get_signed_attribute((PKCS7_SIGNER_INFO *)si,nid);
  iVar1 = ASN1_TYPE_get(a);
  if (iVar1 != type) {
    pcVar3 = "wrong ASN.1 type";
    iVar1 = 0x2da;
LAB_0010b6e3:
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,iVar1,pcVar3);
    exit(0x61);
  }
  uVar2 = ASN1_STRING_length((a->value).asn1_string);
  iVar1 = 1;
  if (0 < (int)uVar2) {
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x2e1,"allocating %d bytes for attribute",(ulong)uVar2);
    pcVar3 = (char *)malloc((ulong)((type == 0x13) + uVar2));
    *buffer = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "cannot malloc space for attribute";
      iVar1 = 0x2e8;
      goto LAB_0010b6e3;
    }
    __src = (void *)ASN1_STRING_get0_data((a->value).ptr);
    memcpy(pcVar3,__src,(ulong)uVar2);
    iVar1 = 0;
    if (type == 0x13) {
      (*buffer)[uVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int get_signed_attribute (PKCS7_SIGNER_INFO *si, int nid, int type, char **buffer){
    ASN1_TYPE   *asn1_type;
    int         len;

    log_debug("finding attribute %s", OBJ_nid2sn(nid));

    /* Find attribute */
    asn1_type = PKCS7_get_signed_attribute(si, nid);

    if (ASN1_TYPE_get(asn1_type) != type) {
        log_error("wrong ASN.1 type");
        exit (SCEP_PKISTATUS_P7);
    }

    /* Copy data */
    len = ASN1_STRING_length(asn1_type->value.asn1_string);
    if (len <= 0) { return (1); }
    log_debug("allocating %d bytes for attribute", len);
    if (type == V_ASN1_PRINTABLESTRING) {
        *buffer = ( char *)malloc(len + 1);
    } else {
        *buffer = ( char *)malloc(len);
    }
    if (*buffer == NULL) {
        log_error("cannot malloc space for attribute");
        exit (SCEP_PKISTATUS_P7);
    }
    memcpy(*buffer, ASN1_STRING_get0_data(asn1_type->value.asn1_string), len);

    /* Add null terminator if it's a PrintableString */
    if (type == V_ASN1_PRINTABLESTRING) {
        (*buffer)[len] = 0;
        len++;
    }

    return (0);
}